

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

Box * __thiscall amrex::Geometry::growNonPeriodicDomain(Geometry *this,int ngrow)

{
  bool bVar1;
  Box *pBVar2;
  int in_EDX;
  Geometry *in_RSI;
  Box *in_RDI;
  Box *b;
  int idim;
  int local_10;
  
  pBVar2 = Domain(in_RSI);
  *(undefined8 *)(in_RDI->smallend).vect = *(undefined8 *)(pBVar2->smallend).vect;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = *(undefined8 *)((pBVar2->smallend).vect + 2);
  *(undefined8 *)((in_RDI->bigend).vect + 1) = *(undefined8 *)((pBVar2->bigend).vect + 1);
  (in_RDI->btype).itype = (pBVar2->btype).itype;
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    bVar1 = isPeriodic(in_RSI,local_10);
    if (!bVar1) {
      Box::grow(in_RDI,local_10,in_EDX);
    }
  }
  return in_RDI;
}

Assistant:

Box
Geometry::growNonPeriodicDomain (int ngrow) const noexcept
{
    Box b = Domain();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (!isPeriodic(idim)) {
            b.grow(idim,ngrow);
        }
    }
    return b;
}